

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

_Bool queue_init(queue_t *queue)

{
  _Bool status;
  queue_t *queue_local;
  
  if (queue != (queue_t *)0x0) {
    memset(queue,0,0x18);
  }
  return queue != (queue_t *)0x0;
}

Assistant:

bool queue_init(queue_t *queue)
{
    bool status = false;

    if (queue == NULL) {
        goto EXIT;
    }

    bzero(queue, sizeof(queue_t));
    status = true;

EXIT:
    return status;
}